

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddField(DuckTableEntry *this,ClientContext *context,AddFieldInfo *info)

{
  AlterInfo *this_00;
  pointer pcVar1;
  AddFieldInfo *info_00;
  reference pvVar2;
  ColumnDefinition *this_01;
  LogicalType *pLVar3;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> this_02;
  ConstantExpression *pCVar4;
  string *psVar5;
  AlterInfo *in_RCX;
  pointer *__ptr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  ChangeColumnTypeInfo change_column_type;
  StructMappingInfo res;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2c8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2b8;
  AddFieldInfo *local_298;
  _Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_> local_290;
  ClientContext *local_288;
  Value local_280;
  LogicalType local_240;
  string local_228;
  LogicalType local_208;
  ChangeColumnTypeInfo local_1f0;
  undefined1 local_138 [160];
  AlterEntryData local_98;
  
  this_00 = in_RCX + 1;
  pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,0);
  local_288 = context;
  this_01 = ColumnList::GetColumn((ColumnList *)&(context->config).asof_loop_join_threshold,pvVar2);
  pLVar3 = ColumnDefinition::Type(this_01);
  AddFieldToStruct((StructMappingInfo *)local_138,pLVar3,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)this_00,(ColumnDefinition *)&in_RCX[1].catalog._M_string_length,0);
  if (local_138[0x20] == true) {
    if (*(char *)&in_RCX[3].super_ParseInfo._vptr_ParseInfo == '\0') {
      local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
           (_func_int **)&local_1f0.super_AlterTableInfo.super_AlterInfo.catalog;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,anon_var_dwarf_643837b + 9);
      ErrorData::Throw((ErrorData *)(local_138 + 0x20),(string *)&local_1f0);
    }
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)0x0;
  }
  else {
    local_2b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298 = info;
    local_290.super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)
         (_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)this;
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,0);
    this_02.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )operator_new(0x50);
    psVar5 = &local_1f0.super_AlterTableInfo.super_AlterInfo.catalog;
    pcVar1 = (pvVar2->_M_dataplus)._M_p;
    local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)psVar5;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar1,pcVar1 + pvVar2->_M_string_length);
    ColumnRefExpression::ColumnRefExpression
              ((ColumnRefExpression *)
               this_02.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
               (string *)&local_1f0);
    if ((string *)local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo !=
        psVar5) {
      operator_delete(local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo
                     );
    }
    local_280.type_._0_8_ =
         this_02.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_2b8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_280);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_280.type_._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_280.type_._0_8_ + 8))();
    }
    LogicalType::LogicalType(&local_240,(LogicalType *)local_138);
    Value::Value(&local_280,&local_240);
    pCVar4 = (ConstantExpression *)operator_new(0x78);
    Value::Value((Value *)&local_1f0,&local_280);
    ConstantExpression::ConstantExpression(pCVar4,(Value *)&local_1f0);
    Value::~Value((Value *)&local_1f0);
    local_2c8._M_head_impl = (ParsedExpression *)pCVar4;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_2b8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2c8);
    if ((ConstantExpression *)local_2c8._M_head_impl != (ConstantExpression *)0x0) {
      (*((BaseExpression *)&((local_2c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_2c8._M_head_impl = (ParsedExpression *)0x0;
    Value::~Value(&local_280);
    LogicalType::~LogicalType(&local_240);
    psVar5 = ColumnDefinition::Name_abi_cxx11_(this_01);
    pLVar3 = ColumnDefinition::Type(this_01);
    ConstructMapping(&local_280,psVar5,pLVar3);
    pCVar4 = (ConstantExpression *)operator_new(0x78);
    Value::Value((Value *)&local_1f0,&local_280);
    ConstantExpression::ConstantExpression(pCVar4,(Value *)&local_1f0);
    Value::~Value((Value *)&local_1f0);
    local_2c8._M_head_impl = (ParsedExpression *)pCVar4;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_2b8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2c8);
    if ((ConstantExpression *)local_2c8._M_head_impl != (ConstantExpression *)0x0) {
      (*((BaseExpression *)&((local_2c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_2c8._M_head_impl = (ParsedExpression *)0x0;
    Value::~Value(&local_280);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_2b8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_138 + 0x18));
    make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_280,(char (*) [13])"remap_struct",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_2b8);
    AlterInfo::GetAlterEntryData(&local_98,in_RCX);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,0);
    pcVar1 = (pvVar2->_M_dataplus)._M_p;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar1,pcVar1 + pvVar2->_M_string_length);
    LogicalType::LogicalType(&local_208,(LogicalType *)local_138);
    local_2c0._M_head_impl = (ParsedExpression *)local_280.type_._0_8_;
    local_280.type_._0_8_ =
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    ChangeColumnTypeInfo::ChangeColumnTypeInfo
              (&local_1f0,&local_98,&local_228,&local_208,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2c0);
    if ((ColumnRefExpression *)local_2c0._M_head_impl != (ColumnRefExpression *)0x0) {
      (*((BaseExpression *)&((local_2c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_2c0._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    this = (DuckTableEntry *)
           local_290.super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    info_00 = local_298;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
      operator_delete(local_98.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.schema._M_dataplus._M_p != &local_98.schema.field_2) {
      operator_delete(local_98.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.catalog._M_dataplus._M_p != &local_98.catalog.field_2) {
      operator_delete(local_98.catalog._M_dataplus._M_p);
    }
    ChangeColumnType(this,local_288,(ChangeColumnTypeInfo *)info_00);
    ChangeColumnTypeInfo::~ChangeColumnTypeInfo(&local_1f0);
    if ((ParsedExpression *)local_280.type_._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_280.type_._0_8_ + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_2b8);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_138 + 0x68));
  if ((undefined1 *)local_138._72_8_ != local_138 + 0x58) {
    operator_delete((void *)local_138._72_8_);
  }
  if ((undefined1 *)local_138._40_8_ != local_138 + 0x38) {
    operator_delete((void *)local_138._40_8_);
  }
  if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_138._24_8_ !=
      (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (*((BaseExpression *)local_138._24_8_)->_vptr_BaseExpression[1])();
  }
  local_138._24_8_ =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
  LogicalType::~LogicalType((LogicalType *)local_138);
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddField(ClientContext &context, AddFieldInfo &info) {
	// follow the path
	auto &col = GetColumn(info.column_path[0]);
	auto res = AddFieldToStruct(col.Type(), info.column_path, info.new_field);
	if (res.error.HasError()) {
		if (!info.if_field_not_exists) {
			res.error.Throw();
		}
		return nullptr;
	}

	// construct the struct remapping expression
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ColumnRefExpression>(info.column_path[0]));
	children.push_back(make_uniq<ConstantExpression>(Value(res.new_type)));
	children.push_back(make_uniq<ConstantExpression>(ConstructMapping(col.Name(), col.Type())));
	children.push_back(std::move(res.default_value));

	auto function = make_uniq<FunctionExpression>("remap_struct", std::move(children));

	ChangeColumnTypeInfo change_column_type(info.GetAlterEntryData(), info.column_path[0], std::move(res.new_type),
	                                        std::move(function));
	return ChangeColumnType(context, change_column_type);
}